

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

void __thiscall
bandit::detail::bandit_context::register_before_each(bandit_context *this,voidfunc_t *func)

{
  test_run_error *this_00;
  voidfunc_t *func_local;
  bandit_context *this_local;
  
  if ((this->is_executing_ & 1U) != 0) {
    this_00 = (test_run_error *)__cxa_allocate_exception(0x10);
    test_run_error::test_run_error(this_00,"before_each was called after \'describe\' or \'it\'");
    __cxa_throw(this_00,&test_run_error::typeinfo,test_run_error::~test_run_error);
  }
  std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
            (&this->before_eaches_,func);
  return;
}

Assistant:

void register_before_each(voidfunc_t func)
        {
          if(is_executing_)
          {
            throw test_run_error("before_each was called after 'describe' or 'it'");
          }

          before_eaches_.push_back(func);
        }